

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<TPZSemaphore>::Resize(TPZVec<TPZSemaphore> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  int64_t *piVar3;
  TPZSemaphore *pTVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  TPZSemaphore *pTVar8;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar4 = this->fStore;
      if (pTVar4 != (TPZSemaphore *)0x0) {
        lVar6 = *(long *)&pTVar4[-1].field_0x58;
        if (lVar6 != 0) {
          lVar7 = lVar6 * 0x60;
          do {
            std::condition_variable::~condition_variable
                      ((condition_variable *)((long)pTVar4 + lVar7 + -0x30));
            lVar7 = lVar7 + -0x60;
          } while (lVar7 != 0);
        }
        operator_delete__(&pTVar4[-1].field_0x58,lVar6 * 0x60 + 8);
      }
      this->fStore = (TPZSemaphore *)0x0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = newsize;
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x60),8) == 0) {
        uVar5 = SUB168(auVar1 * ZEXT816(0x60),0) | 8;
      }
      piVar3 = (int64_t *)operator_new__(uVar5);
      *piVar3 = newsize;
      pTVar8 = (TPZSemaphore *)(piVar3 + 1);
      pTVar4 = pTVar8;
      do {
        pTVar4->fCounter = 0;
        (pTVar4->fMutex).super___mutex_base._M_mutex.__align = 0;
        *(undefined8 *)((long)&(pTVar4->fMutex).super___mutex_base._M_mutex + 8) = 0;
        *(undefined8 *)((long)&(pTVar4->fMutex).super___mutex_base._M_mutex + 0x10) = 0;
        (pTVar4->fMutex).super___mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        (pTVar4->fMutex).super___mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)0x0;
        std::condition_variable::condition_variable(&pTVar4->fCond);
        pTVar4 = pTVar4 + 1;
      } while (pTVar4 != (TPZSemaphore *)(piVar3 + newsize * 0xc + 1));
      lVar6 = this->fNElements;
      if (newsize <= lVar6) {
        lVar6 = newsize;
      }
      if (0 < lVar6) {
        lVar7 = 0;
        do {
          TPZSemaphore::operator=
                    ((TPZSemaphore *)((long)&pTVar8->fCounter + lVar7),
                     (TPZSemaphore *)((long)&this->fStore->fCounter + lVar7));
          lVar7 = lVar7 + 0x60;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      pTVar4 = this->fStore;
      if (pTVar4 != (TPZSemaphore *)0x0) {
        lVar6 = *(long *)&pTVar4[-1].field_0x58;
        if (lVar6 != 0) {
          lVar7 = lVar6 * 0x60;
          do {
            std::condition_variable::~condition_variable
                      ((condition_variable *)((long)pTVar4 + lVar7 + -0x30));
            lVar7 = lVar7 + -0x60;
          } while (lVar7 != 0);
        }
        operator_delete__(&pTVar4[-1].field_0x58,lVar6 * 0x60 + 8);
      }
      this->fStore = pTVar8;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}